

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O0

ssize_t __thiscall Omega_h::vtk::FullWriter::write(FullWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined7 extraout_var;
  reference this_00;
  void *__buf_00;
  int __fd_00;
  Writer *writer;
  iterator __end2;
  iterator __begin2;
  vector<Omega_h::vtk::Writer,_std::allocator<Omega_h::vtk::Writer>_> *__range2;
  Real time_local;
  FullWriter *this_local;
  __normal_iterator<Omega_h::vtk::Writer_*,_std::vector<Omega_h::vtk::Writer,_std::allocator<Omega_h::vtk::Writer>_>_>
  *__rhs;
  
  __end2 = std::vector<Omega_h::vtk::Writer,_std::allocator<Omega_h::vtk::Writer>_>::begin
                     (&this->writers_);
  writer = (Writer *)
           std::vector<Omega_h::vtk::Writer,_std::allocator<Omega_h::vtk::Writer>_>::end
                     (&this->writers_);
  while( true ) {
    __rhs = (__normal_iterator<Omega_h::vtk::Writer_*,_std::vector<Omega_h::vtk::Writer,_std::allocator<Omega_h::vtk::Writer>_>_>
             *)&writer;
    bVar1 = __gnu_cxx::operator!=(&__end2,__rhs);
    __fd_00 = (int)__rhs;
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<Omega_h::vtk::Writer_*,_std::vector<Omega_h::vtk::Writer,_std::allocator<Omega_h::vtk::Writer>_>_>
              ::operator*(&__end2);
    Writer::write(this_00,__fd_00,__buf_00,__n);
    __gnu_cxx::
    __normal_iterator<Omega_h::vtk::Writer_*,_std::vector<Omega_h::vtk::Writer,_std::allocator<Omega_h::vtk::Writer>_>_>
    ::operator++(&__end2);
  }
  return CONCAT71(extraout_var,bVar1);
}

Assistant:

void FullWriter::write(Real time) {
  for (auto& writer : writers_) writer.write(time);
}